

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethpccal.cpp
# Opt level: O0

int32_t __thiscall icu_63::EthiopicCalendar::handleGetExtendedYear(EthiopicCalendar *this)

{
  UBool UVar1;
  UCalendarDateFields UVar2;
  int32_t iVar3;
  undefined4 local_14;
  int32_t era;
  int32_t eyear;
  EthiopicCalendar *this_local;
  
  UVar2 = Calendar::newerField((Calendar *)this,UCAL_EXTENDED_YEAR,UCAL_YEAR);
  if (UVar2 == UCAL_EXTENDED_YEAR) {
    local_14 = Calendar::internalGet((Calendar *)this,UCAL_EXTENDED_YEAR,1);
  }
  else {
    UVar1 = isAmeteAlemEra(this);
    if (UVar1 == '\0') {
      iVar3 = Calendar::internalGet((Calendar *)this,UCAL_ERA,1);
      if (iVar3 == 1) {
        local_14 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,1);
      }
      else {
        local_14 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,1);
        local_14 = local_14 + -0x157c;
      }
    }
    else {
      local_14 = Calendar::internalGet((Calendar *)this,UCAL_YEAR,0x157d);
      local_14 = local_14 + -0x157c;
    }
  }
  return local_14;
}

Assistant:

int32_t
EthiopicCalendar::handleGetExtendedYear()
{
    // Ethiopic calendar uses EXTENDED_YEAR aligned to
    // Amelete Hihret year always.
    int32_t eyear;
    if (newerField(UCAL_EXTENDED_YEAR, UCAL_YEAR) == UCAL_EXTENDED_YEAR) {
        eyear = internalGet(UCAL_EXTENDED_YEAR, 1); // Default to year 1
    } else if (isAmeteAlemEra()) {
        eyear = internalGet(UCAL_YEAR, 1 + AMETE_MIHRET_DELTA)
            - AMETE_MIHRET_DELTA; // Default to year 1 of Amelete Mihret
    } else {
        // The year defaults to the epoch start, the era to AMETE_MIHRET
        int32_t era = internalGet(UCAL_ERA, AMETE_MIHRET);
        if (era == AMETE_MIHRET) {
            eyear = internalGet(UCAL_YEAR, 1); // Default to year 1
        } else {
            eyear = internalGet(UCAL_YEAR, 1) - AMETE_MIHRET_DELTA;
        }
    }
    return eyear;
}